

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O0

void Sbd_StoComputeCutsTest(Gia_Man_t *pGia)

{
  double dVar1;
  Gia_Man_t *p_00;
  int iVar2;
  Sbd_Sto_t *p_01;
  Gia_Obj_t *pObj_00;
  abctime aVar3;
  bool bVar4;
  int local_28;
  int local_24;
  int iObj;
  int i;
  Gia_Obj_t *pObj;
  Sbd_Sto_t *p;
  Gia_Man_t *pGia_local;
  
  p_01 = Sbd_StoAlloc(pGia,(Vec_Int_t *)0x0,4,8,100,1,1);
  local_28 = 0;
  while( true ) {
    bVar4 = false;
    if (local_28 < p_01->pGia->nObjs) {
      _iObj = Gia_ManObj(p_01->pGia,local_28);
      bVar4 = _iObj != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    Sbd_StoRefObj(p_01,local_28,-1);
    local_28 = local_28 + 1;
  }
  Sbd_StoComputeCutsConst0(p_01,0);
  local_24 = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p_01->pGia->vCis);
    bVar4 = false;
    if (local_24 < iVar2) {
      p_00 = p_01->pGia;
      pObj_00 = Gia_ManCi(p_01->pGia,local_24);
      local_28 = Gia_ObjId(p_00,pObj_00);
      bVar4 = local_28 != 0;
    }
    if (!bVar4) break;
    Sbd_StoComputeCutsCi(p_01,local_28,0,0);
    local_24 = local_24 + 1;
  }
  local_28 = 0;
  while( true ) {
    bVar4 = false;
    if (local_28 < p_01->pGia->nObjs) {
      _iObj = Gia_ManObj(p_01->pGia,local_28);
      bVar4 = _iObj != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar2 = Gia_ObjIsAnd(_iObj);
    if (iVar2 != 0) {
      Sbd_StoComputeCutsNode(p_01,local_28);
    }
    local_28 = local_28 + 1;
  }
  if (p_01->fVerbose != 0) {
    printf("Running cut computation with LutSize = %d  CutSize = %d  CutNum = %d:\n",
           (ulong)(uint)p_01->nLutSize,(ulong)(uint)p_01->nCutSize,(ulong)(uint)p_01->nCutNum);
    printf("CutPair = %.0f  ",p_01->CutCount[0]);
    printf("Merge = %.0f (%.2f %%)  ",p_01->CutCount[1],
           (p_01->CutCount[1] * 100.0) / p_01->CutCount[0]);
    printf("Eval = %.0f (%.2f %%)  ",p_01->CutCount[2],
           (p_01->CutCount[2] * 100.0) / p_01->CutCount[0]);
    printf("Cut = %.0f (%.2f %%)  ",p_01->CutCount[3],
           (p_01->CutCount[3] * 100.0) / p_01->CutCount[0]);
    dVar1 = p_01->CutCount[3];
    iVar2 = Gia_ManAndNum(p_01->pGia);
    printf("Cut/Node = %.2f  ",dVar1 / (double)iVar2);
    printf("\n");
    printf("Spec = %4d  ",(ulong)(uint)p_01->nCutsSpec);
    printf("Over = %4d  ",(ulong)(uint)p_01->nCutsOver);
    printf("Lev = %4d  ",(ulong)(uint)p_01->DelayMin);
    aVar3 = Abc_Clock();
    Abc_PrintTime(0,"Time",aVar3 - p_01->clkStart);
  }
  Sbd_StoFree(p_01);
  return;
}

Assistant:

void Sbd_StoComputeCutsTest( Gia_Man_t * pGia )
{
    Sbd_Sto_t * p = Sbd_StoAlloc( pGia, NULL, 4, 8, 100, 1, 1 );
    Gia_Obj_t * pObj;   
    int i, iObj;
    // prepare references
    Gia_ManForEachObj( p->pGia, pObj, iObj )
        Sbd_StoRefObj( p, iObj, -1 );
    // compute cuts
    Sbd_StoComputeCutsConst0( p, 0 );
    Gia_ManForEachCiId( p->pGia, iObj, i )
        Sbd_StoComputeCutsCi( p, iObj, 0, 0 );
    Gia_ManForEachAnd( p->pGia, pObj, iObj )
        Sbd_StoComputeCutsNode( p, iObj );
    if ( p->fVerbose )
    {
        printf( "Running cut computation with LutSize = %d  CutSize = %d  CutNum = %d:\n", p->nLutSize, p->nCutSize, p->nCutNum );
        printf( "CutPair = %.0f  ",         p->CutCount[0] );
        printf( "Merge = %.0f (%.2f %%)  ", p->CutCount[1], 100.0*p->CutCount[1]/p->CutCount[0] );
        printf( "Eval = %.0f (%.2f %%)  ",  p->CutCount[2], 100.0*p->CutCount[2]/p->CutCount[0] );
        printf( "Cut = %.0f (%.2f %%)  ",   p->CutCount[3], 100.0*p->CutCount[3]/p->CutCount[0] );
        printf( "Cut/Node = %.2f  ",        p->CutCount[3] / Gia_ManAndNum(p->pGia) );
        printf( "\n" );
        printf( "Spec = %4d  ",             p->nCutsSpec );
        printf( "Over = %4d  ",             p->nCutsOver );
        printf( "Lev = %4d  ",              p->DelayMin );
        Abc_PrintTime( 0, "Time", Abc_Clock() - p->clkStart );
    }
    Sbd_StoFree( p );
}